

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateFastBrOrCmEqDefinite
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool *pNeedHelper,bool isBranch,
          bool isInHelper)

{
  Lowerer *pLVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  uint32 offset;
  Lowerer *this_00;
  undefined4 *puVar6;
  BranchInstr *pBVar7;
  Opnd *pOVar8;
  RegOpnd *pRVar9;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar10;
  IntConstOpnd *src2;
  Lowerer *compareSrc2;
  LabelInstr *pLVar11;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar12;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  Lowerer *pLVar13;
  LabelInstr *branchTarget;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_88;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_86;
  undefined4 local_84;
  LabelInstr *local_80;
  LabelInstr *local_78;
  Lowerer *local_70;
  Lowerer *local_68;
  LabelInstr *local_60;
  LabelInstr *local_58;
  LibraryValue local_4c;
  LibraryValue local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  Lowerer *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  local_70 = (Lowerer *)CONCAT44(local_70._4_4_,(int)CONCAT71(in_register_00000089,isInHelper));
  pLVar1 = (Lowerer *)instr->m_src1;
  pLVar13 = (Lowerer *)instr->m_src2;
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(pLVar1->m_lowererMD).FloatPrefThreshold;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  if (!bVar4) {
    local_42 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(pLVar13->m_lowererMD).FloatPrefThreshold;
    bVar4 = ValueType::IsDefinite((ValueType *)&local_42.field_0);
    if (!bVar4) {
      return false;
    }
  }
  local_40 = pLVar13;
  bVar4 = IR::Opnd::IsEqual((Opnd *)pLVar1,(Opnd *)pLVar13);
  if (bVar4) {
    return false;
  }
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(pLVar1->m_lowererMD).FloatPrefThreshold;
  local_68 = this;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  if (bVar4) {
    local_42 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(local_40->m_lowererMD).FloatPrefThreshold;
    bVar4 = ValueType::IsDefinite((ValueType *)&local_42.field_0);
    if (bVar4) {
      bVar4 = IR::Opnd::IsTaggedValue((Opnd *)pLVar1);
      if (bVar4) {
        return true;
      }
      bVar4 = IR::Opnd::IsTaggedValue((Opnd *)local_40);
      if (bVar4) {
        return true;
      }
    }
  }
  local_78 = IR::Instr::GetOrCreateContinueLabel(instr,false);
  local_80 = IR::LabelInstr::New(Label,local_68->m_func,local_70._0_1_);
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(pLVar1->m_lowererMD).FloatPrefThreshold;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  pLVar13 = local_40;
  this_00 = local_40;
  if (bVar4) {
    this_00 = pLVar1;
  }
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(pLVar1->m_lowererMD).FloatPrefThreshold;
  bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
  local_70 = pLVar1;
  if (bVar4) {
    local_70 = pLVar13;
  }
  bVar4 = IR::Instr::IsNeq(instr);
  compareSrc2 = local_40;
  pLVar13 = local_68;
  local_84 = (undefined4)CONCAT71(in_register_00000081,isBranch);
  if (isBranch) {
    if (bVar4) {
      if (instr->m_kind != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
        if (!bVar4) goto LAB_005d49d7;
        *puVar6 = 0;
      }
      local_58 = (LabelInstr *)instr[1].m_next;
      local_60 = local_78;
    }
    else {
      if (instr->m_kind != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
        if (!bVar4) goto LAB_005d49d7;
        *puVar6 = 0;
      }
      local_60 = (LabelInstr *)instr[1].m_next;
      local_58 = local_78;
    }
    local_48 = ValueInvalid;
    local_4c = ValueInvalid;
    pLVar13 = local_68;
  }
  else {
    local_60 = IR::LabelInstr::New(Label,local_68->m_func,false);
    local_58 = IR::LabelInstr::New(Label,pLVar13->m_func,false);
    local_4c = ValueFalse - bVar4;
    local_48 = bVar4 + ValueTrue;
    compareSrc2 = local_40;
  }
  OVar5 = IR::Opnd::GetKind((Opnd *)local_70);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5d93,"(likelySrc->IsRegOpnd())","likelySrc->IsRegOpnd()");
    if (!bVar4) {
LAB_005d49d7:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    pLVar13 = local_68;
  }
  local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this_00->m_lowererMD).FloatPrefThreshold
  ;
  paVar12 = &local_32;
  bVar4 = ValueType::IsAnyArray((ValueType *)&paVar12->field_0);
  if (!bVar4) {
    local_42 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(this_00->m_lowererMD).FloatPrefThreshold;
    paVar12 = &local_42;
    bVar4 = ValueType::IsSymbol((ValueType *)&paVar12->field_0);
    if (!bVar4) {
      local_88 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(this_00->m_lowererMD).FloatPrefThreshold;
      paVar12 = &local_88;
      bVar4 = ValueType::IsBoolean((ValueType *)&paVar12->field_0);
      if (!bVar4) {
        local_86 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                    &(this_00->m_lowererMD).FloatPrefThreshold;
        paVar12 = &local_86;
        bVar4 = ValueType::IsPrimitiveOrObject((ValueType *)&paVar12->field_0);
        if (!bVar4) {
          local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                      &(this_00->m_lowererMD).FloatPrefThreshold;
          paVar12 = &local_32;
          bVar4 = ValueType::IsObject((ValueType *)&paVar12->field_0);
          pLVar11 = local_60;
          if ((bVar4) && ((DAT_0159921f & 1) == 0)) {
            InsertCompareBranch((Lowerer *)&paVar12->field_0,(Opnd *)pLVar1,(Opnd *)compareSrc2,
                                BrEq_A,false,local_60,instr,false);
            pLVar1 = local_70;
            local_32 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(local_70->m_lowererMD).FloatPrefThreshold;
            bVar4 = ValueType::IsDefinite((ValueType *)&local_32.field_0);
            if (bVar4) {
              *pNeedHelper = false;
              branchTarget = local_58;
            }
            else {
              local_40 = (Lowerer *)instr;
              pRVar9 = IR::Opnd::AsRegOpnd((Opnd *)pLVar1);
              branchTarget = local_58;
              LowererMD::GenerateObjectTest
                        (&pLVar13->m_lowererMD,&pRVar9->super_Opnd,(Instr *)local_40,local_58,false)
              ;
              pRVar9 = IR::RegOpnd::New(TyInt64,pLVar13->m_func);
              baseOpnd = IR::Opnd::AsRegOpnd((Opnd *)pLVar1);
              pIVar10 = IR::IndirOpnd::New(baseOpnd,8,TyInt64,pLVar13->m_func,false);
              InsertMove(&pRVar9->super_Opnd,&pIVar10->super_Opnd,(Instr *)local_40,true);
              offset = Js::Type::GetOffsetOfFlags();
              pIVar10 = IR::IndirOpnd::New(pRVar9,offset,TyInt8,pLVar13->m_func,false);
              src2 = IR::IntConstOpnd::New(8,TyInt8,pLVar13->m_func,false);
              instr = (Instr *)local_40;
              pLVar11 = local_60;
              InsertTest(&pIVar10->super_Opnd,&src2->super_Opnd,(Instr *)local_40);
              InsertBranch(BrNeq_A,false,local_80,instr);
            }
            pBVar7 = IR::BranchInstr::New(JMP,branchTarget,pLVar13->m_func);
            IR::Instr::InsertBefore(instr,&pBVar7->super_Instr);
          }
          else {
            bVar4 = IR::Opnd::IsTaggedInt((Opnd *)this_00);
            pLVar11 = local_60;
            if (!bVar4) {
              return true;
            }
            InsertCompareBranch(this_00,(Opnd *)pLVar1,(Opnd *)local_40,BrEq_A,false,local_60,instr,
                                false);
            pLVar13 = local_68;
            pBVar7 = IR::BranchInstr::New(JMP,local_80,local_68->m_func);
            IR::Instr::InsertBefore(instr,&pBVar7->super_Instr);
            branchTarget = local_58;
          }
          goto LAB_005d474a;
        }
      }
    }
  }
  pLVar11 = local_60;
  InsertCompareBranch((Lowerer *)&paVar12->field_0,(Opnd *)pLVar1,(Opnd *)compareSrc2,BrEq_A,false,
                      local_60,instr,false);
  branchTarget = local_58;
  pBVar7 = IR::BranchInstr::New(JMP,local_58,pLVar13->m_func);
  IR::Instr::InsertBefore(instr,&pBVar7->super_Instr);
  *pNeedHelper = false;
LAB_005d474a:
  if ((char)local_84 == '\0') {
    IR::Instr::InsertBefore(instr,&pLVar11->super_Instr);
    pOVar2 = (((Lowerer *)instr)->m_lowererMD).lowererMDArch.helperCallArgs[1];
    pOVar8 = LoadLibraryValueOpnd(pLVar13,instr,local_48);
    InsertMove(pOVar2,pOVar8,instr,true);
    pLVar11 = local_78;
    InsertBranch(Br,false,local_78,instr);
    IR::Instr::InsertBefore(instr,&branchTarget->super_Instr);
    pOVar2 = (((Lowerer *)instr)->m_lowererMD).lowererMDArch.helperCallArgs[1];
    pOVar8 = LoadLibraryValueOpnd(pLVar13,instr,local_4c);
    InsertMove(pOVar2,pOVar8,instr,true);
    InsertBranch(Br,false,pLVar11,instr);
  }
  IR::Instr::InsertBefore(instr,&local_80->super_Instr);
  return true;
}

Assistant:

bool Lowerer::GenerateFastBrOrCmEqDefinite(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool *pNeedHelper, bool isBranch, bool isInHelper)
{
    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    if (!src1->GetValueType().IsDefinite() && !src2->GetValueType().IsDefinite())
    {
        return false;
    }
    if (src1->IsEqual(src2))
    {
        return false;
    }
    if (src1->GetValueType().IsDefinite() && src2->GetValueType().IsDefinite())
    {
        if (src1->IsTaggedValue() || src2->IsTaggedValue())
        {
            return true;
        }
    }

    IR::LabelInstr * labelBranchSuccess = nullptr;
    IR::LabelInstr * labelBranchFailure = nullptr;
    IR::LabelInstr * labelFallThrough = instr->GetOrCreateContinueLabel();
    IR::LabelInstr * labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);

    LibraryValue successValueType = ValueInvalid;
    LibraryValue failureValueType = ValueInvalid;

    IR::Opnd * definiteSrc = src1->GetValueType().IsDefinite() ? src1 : src2;
    IR::Opnd * likelySrc = src1->GetValueType().IsDefinite() ? src2 : src1;

    bool isEqual = !instr->IsNeq();

    if (!isBranch)
    {
        labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
        labelBranchFailure = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
        successValueType = isEqual ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
        failureValueType = isEqual ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
    }
    else
    {
        labelBranchSuccess = isEqual ? instr->AsBranchInstr()->GetTarget() : labelFallThrough;
        labelBranchFailure = isEqual ? labelFallThrough : instr->AsBranchInstr()->GetTarget();
    }

    Assert(likelySrc->IsRegOpnd());

    if (definiteSrc->GetValueType().IsAnyArray() || definiteSrc->GetValueType().IsSymbol() || definiteSrc->GetValueType().IsBoolean() || definiteSrc->GetValueType().IsPrimitiveOrObject())
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);
        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
        instr->InsertBefore(branch);
        *pNeedHelper = false;
    }
    else if (definiteSrc->GetValueType().IsObject() && !CONFIG_FLAG(ESBigInt))
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);

        if (!likelySrc->GetValueType().IsDefinite())
        {
            m_lowererMD.GenerateObjectTest(likelySrc->AsRegOpnd(), instr, labelBranchFailure);
            IR::RegOpnd * likelyTypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            IR::IndirOpnd * likelyType = IR::IndirOpnd::New(likelySrc->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
            Lowerer::InsertMove(likelyTypeReg, likelyType, instr);
            IR::Opnd *likelyFlags = IR::IndirOpnd::New(likelyTypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
            InsertTestBranch(likelyFlags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);
        }
        else
        {
            *pNeedHelper = false;
        }

        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
        instr->InsertBefore(branch);
    }
    else if (definiteSrc->IsTaggedInt())
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);
        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func);
        instr->InsertBefore(branch);
    }
    else
    {
        return true;
    }

    if (!isBranch)
    {
        instr->InsertBefore(labelBranchSuccess);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallThrough, instr);

        instr->InsertBefore(labelBranchFailure);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, failureValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
    }

    instr->InsertBefore(labelHelper);

    return true;
}